

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_random(lua_State *L)

{
  int iVar1;
  uint arg;
  ulong uVar2;
  lua_Integer lVar3;
  
  iVar1 = rand();
  arg = lua_gettop(L);
  uVar2 = (ulong)arg;
  if (arg == 2) {
    uVar2 = luaL_checkinteger(L,1);
  }
  else if (arg != 1) {
    if (arg == 0) {
      lua_pushnumber(L,(double)iVar1 * 4.656612873077393e-10);
      return 1;
    }
    iVar1 = luaL_error(L,"wrong number of arguments");
    return iVar1;
  }
  lVar3 = luaL_checkinteger(L,arg);
  if (lVar3 < (long)uVar2) {
    luaL_argerror(L,1,"interval is empty");
  }
  if ((long)(uVar2 + 0x7fffffffffffffff) < lVar3 && (long)uVar2 < 0) {
    luaL_argerror(L,1,"interval too large");
  }
  lua_pushinteger(L,uVar2 + (long)((double)iVar1 * 4.656612873077393e-10 *
                                  ((double)(long)(lVar3 - uVar2) + 1.0)));
  return 1;
}

Assistant:

static int math_random(lua_State *L) {
    lua_Integer low, up;
    double r = (double) l_rand() * (1.0 / ((double) L_RANDMAX + 1.0));
    switch (lua_gettop(L)) {  /* check number of arguments */
        case 0: {  /* no arguments */
            lua_pushnumber(L, (lua_Number) r);  /* Number between 0 and 1 */
            return 1;
        }
        case 1: {  /* only upper limit */
            low = 1;
            up = luaL_checkinteger(L, 1);
            break;
        }
        case 2: {  /* lower and upper limits */
            low = luaL_checkinteger(L, 1);
            up = luaL_checkinteger(L, 2);
            break;
        }
        default:
            return luaL_error(L, "wrong number of arguments");
    }
    /* random integer in the interval [low, up] */
    luaL_argcheck(L, low <= up, 1, "interval is empty");
    luaL_argcheck(L, low >= 0 || up <= LUA_MAXINTEGER + low, 1,
                  "interval too large");
    r *= (double) (up - low) + 1.0;
    lua_pushinteger(L, (lua_Integer) r + low);
    return 1;
}